

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_AzureStoragePutBlock
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle,
          uint32_t blockNumber,uint8_t *dataPtr,size_t dataSize)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  size_t dataSize_local;
  uint8_t *dataPtr_local;
  uint32_t blockNumber_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle_local;
  
  if (((azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) ||
      (dataPtr == (uint8_t *)0x0)) || (dataSize == 0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_AzureStoragePutBlock",0xbd4,1,
                "invalid parameters azureStorageClientHandle=%p, dataPtr=%p, dataSize=%zu",
                azureStorageClientHandle,dataPtr,dataSize);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    l._4_4_ = IoTHubClient_LL_UploadToBlob_PutBlock
                        (azureStorageClientHandle,blockNumber,dataPtr,dataSize);
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_AzureStoragePutBlock(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle, uint32_t blockNumber, const uint8_t* dataPtr, size_t dataSize)
{
    IOTHUB_CLIENT_RESULT result;

    if (
        (azureStorageClientHandle == NULL) ||
        (dataPtr == NULL) ||
        (dataSize == 0)
        )
    {
        LogError("invalid parameters azureStorageClientHandle=%p, dataPtr=%p, dataSize=%zu", azureStorageClientHandle, dataPtr, dataSize);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        result = IoTHubClient_LL_UploadToBlob_PutBlock(azureStorageClientHandle, blockNumber, dataPtr, dataSize);
    }

    return result;
}